

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sit.c
# Opt level: O3

void take_gold(void)

{
  obj *poVar1;
  bool bVar2;
  obj *obj;
  
  if (invent != (obj *)0x0) {
    bVar2 = true;
    obj = invent;
    do {
      while (poVar1 = obj->nobj, obj->oclass == '\f') {
        delobj(obj);
        bVar2 = false;
        obj = poVar1;
        if (poVar1 == (obj *)0x0) goto LAB_0024455d;
      }
      obj = poVar1;
    } while (poVar1 != (obj *)0x0);
    if (!bVar2) {
LAB_0024455d:
      pline("You notice you have no money!");
      iflags.botl = '\x01';
      return;
    }
  }
  pline("You feel a strange sensation.");
  return;
}

Assistant:

void take_gold(void)
{
        struct obj *otmp, *nobj;
	int lost_money = 0;
	for (otmp = invent; otmp; otmp = nobj) {
		nobj = otmp->nobj;
		if (otmp->oclass == COIN_CLASS) {
			lost_money = 1;
			delobj(otmp);
		}
	}
	if (!lost_money)  {
		pline("You feel a strange sensation.");
	} else {
		pline("You notice you have no money!");
		iflags.botl = 1;
	}
}